

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O1

void __thiscall
CorUnix::CSharedMemoryWaitableObject::~CSharedMemoryWaitableObject
          (CSharedMemoryWaitableObject *this)

{
  (this->super_CSharedMemoryObject).super_CPalObjectBase.super_IPalObject._vptr_IPalObject =
       (_func_int **)&PTR_GetObjectType_00188b68;
  if (PAL_InitializeChakraCoreCalled != false) {
    if ((this->super_CSharedMemoryObject).m_fSharedDataDereferenced == 0) {
      fprintf(_stderr,"] %s %s:%d","~CSharedMemoryWaitableObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
              ,0x524);
      fprintf(_stderr,
              "DereferenceSharedData not called before object destructor -- delete called directly?\n"
             );
      CSharedMemoryObject::DereferenceSharedData(&this->super_CSharedMemoryObject);
    }
    if ((this->m_pvSynchData != (VOID *)0x0) &&
       ((this->super_CSharedMemoryObject).m_fDeleteSharedData != 0)) {
      (**(code **)(*g_pSynchronizationManager + 0x40))
                (g_pSynchronizationManager,
                 (this->super_CSharedMemoryObject).super_CPalObjectBase.m_pot,
                 (this->super_CSharedMemoryObject).m_ObjectDomain);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      CSharedMemoryObject::~CSharedMemoryObject(&this->super_CSharedMemoryObject);
      return;
    }
  }
  abort();
}

Assistant:

CSharedMemoryWaitableObject::~CSharedMemoryWaitableObject()
{
    ENTRY("CSharedMemoryWaitableObject::~CSharedMemoryWaitableObject"
        "(this = %p)\n",
        this
        );
    
    if (!m_fSharedDataDereferenced)
    {
        ASSERT("DereferenceSharedData not called before object destructor -- delete called directly?\n");
        DereferenceSharedData();
    }
    
    if (NULL != m_pvSynchData && m_fDeleteSharedData)
    {
        g_pSynchronizationManager->FreeObjectSynchData(
            m_pot,
            m_ObjectDomain,
            m_pvSynchData
            );
    }

    LOGEXIT("CSharedMemoryWaitableObject::~CSharedMemoryWaitableObject\n");
}